

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O3

void __thiscall
Rml::ElementScroll::UpdateScrollElementProperties(ElementScroll *this,Element *scroll_element)

{
  Vector2f vp_dimensions;
  Context *this_00;
  Vector2i VVar1;
  float dp_ratio;
  float fVar2;
  float fVar3;
  
  this_00 = Element::GetContext(this->element);
  if (this_00 == (Context *)0x0) {
    fVar3 = 1.0;
    fVar2 = 1.0;
    dp_ratio = 1.0;
  }
  else {
    dp_ratio = Context::GetDensityIndependentPixelRatio(this_00);
    VVar1 = Context::GetDimensions(this_00);
    fVar3 = (float)VVar1.x;
    fVar2 = (float)VVar1.y;
  }
  vp_dimensions.y = fVar2;
  vp_dimensions.x = fVar3;
  Element::Update(scroll_element,dp_ratio,vp_dimensions);
  return;
}

Assistant:

void ElementScroll::UpdateScrollElementProperties(Element* scroll_element)
{
	// The construction of scrollbars can occur during layouting, then we need some properties and computed values straight away.
	// In particular their size. Furthermore, updating these properties straight away avoids dirtying the document after layouting,
	// which may result in one less additional and unnecessary layouting procedure.

	Context* context = element->GetContext();

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));
	scroll_element->Update(dp_ratio, vp_dimensions);
}